

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::CurrencySymbols::loadSymbol
          (UnicodeString *__return_storage_ptr__,CurrencySymbols *this,UCurrNameStyle selector,
          UErrorCode *status)

{
  char16_t *currency;
  char *locale;
  ConstChar16Ptr local_48;
  UChar *local_40;
  char16_t *symbol;
  int32_t symbolLen;
  UBool ignoredIsChoiceFormatFillIn;
  char16_t *isoCode;
  UErrorCode *status_local;
  CurrencySymbols *pCStack_18;
  UCurrNameStyle selector_local;
  CurrencySymbols *this_local;
  
  isoCode = (char16_t *)status;
  status_local._4_4_ = selector;
  pCStack_18 = this;
  this_local = (CurrencySymbols *)__return_storage_ptr__;
  currency = CurrencyUnit::getISOCurrency(&this->fCurrency);
  symbol._7_1_ = 0;
  symbol._0_4_ = 0;
  _symbolLen = currency;
  locale = CharString::data(&this->fLocaleName);
  local_40 = ucurr_getName_63(currency,locale,status_local._4_4_,(UBool *)((long)&symbol + 7),
                              (int32_t *)&symbol,(UErrorCode *)isoCode);
  if (local_40 == _symbolLen) {
    UnicodeString::UnicodeString(__return_storage_ptr__,_symbolLen,3);
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr(&local_48,local_40);
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_48,(int32_t)symbol);
    ConstChar16Ptr::~ConstChar16Ptr(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CurrencySymbols::loadSymbol(UCurrNameStyle selector, UErrorCode& status) const {
    const char16_t* isoCode = fCurrency.getISOCurrency();
    UBool ignoredIsChoiceFormatFillIn = FALSE;
    int32_t symbolLen = 0;
    const char16_t* symbol = ucurr_getName(
            isoCode,
            fLocaleName.data(),
            selector,
            &ignoredIsChoiceFormatFillIn,
            &symbolLen,
            &status);
    // If given an unknown currency, ucurr_getName returns the input string, which we can't alias safely!
    // Otherwise, symbol points to a resource bundle, and we can use readonly-aliasing constructor.
    if (symbol == isoCode) {
        return UnicodeString(isoCode, 3);
    } else {
        return UnicodeString(TRUE, symbol, symbolLen);
    }
}